

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPrePartialsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  int iVar17;
  uint uVar18;
  double *pdVar19;
  ulong uVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  ulong uVar24;
  double *pdVar25;
  double *pdVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int local_a4;
  long local_a0;
  double *local_98;
  double *local_90;
  double *local_78;
  double *local_70;
  undefined1 auVar29 [64];
  
  uVar6 = this->kStateCount;
  uVar24 = (ulong)uVar6;
  uVar18 = uVar6 + 3;
  if (-1 < (int)uVar6) {
    uVar18 = uVar6;
  }
  if ((long)this->kPartialsSize != 0) {
    memset(destP,0,(long)this->kPartialsSize << 3);
  }
  iVar7 = this->kCategoryCount;
  if (0 < (long)iVar7) {
    uVar12 = uVar6 + 1;
    iVar8 = this->kPartialsPaddedStateCount;
    iVar9 = this->kPatternCount;
    iVar10 = this->kMatrixSize;
    local_a4 = iVar8 * startPattern;
    local_70 = matrices2 + 2;
    local_78 = matrices1 + 3;
    local_a0 = 0;
    local_98 = matrices1;
    local_90 = matrices2;
    do {
      if (startPattern < endPattern) {
        pdVar19 = destP + local_a4;
        pdVar23 = partials2 + local_a4;
        pdVar22 = partials1 + (iVar9 * (int)local_a0 + startPattern) * iVar8;
        iVar17 = startPattern;
        do {
          if (0 < (int)uVar6) {
            uVar20 = 0;
            pdVar16 = local_90;
            pdVar21 = local_78;
            pdVar25 = local_70;
            pdVar26 = local_98;
            do {
              auVar27 = ZEXT816(0) << 0x40;
              auVar29 = ZEXT864(0) << 0x40;
              uVar13 = 0;
              if (3 < (int)uVar6) {
                do {
                  auVar27 = vfmadd231pd_fma(auVar29._0_16_,
                                            *(undefined1 (*) [16])(pdVar25 + (uVar13 - 2)),
                                            *(undefined1 (*) [16])(pdVar23 + uVar13));
                  auVar27 = vfmadd231pd_fma(auVar27,*(undefined1 (*) [16])(pdVar25 + uVar13),
                                            *(undefined1 (*) [16])(pdVar23 + uVar13 + 2));
                  auVar29 = ZEXT1664(auVar27);
                  uVar13 = uVar13 + 4;
                } while ((long)uVar13 < (long)(int)(uVar18 & 0xfffffffc));
              }
              dVar30 = auVar27._0_8_;
              if ((int)uVar13 < (int)uVar6) {
                uVar13 = uVar13 & 0xffffffff;
                auVar11 = auVar27;
                do {
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = pdVar16[uVar13];
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = pdVar23[uVar13];
                  auVar11 = vfmadd231sd_fma(auVar11,auVar36,auVar1);
                  dVar30 = auVar11._0_8_;
                  uVar13 = uVar13 + 1;
                } while (uVar24 != uVar13);
              }
              uVar13 = 0;
              auVar27 = vshufpd_avx(auVar27,auVar27,1);
              dVar30 = (auVar27._0_8_ + dVar30) * pdVar22[uVar20];
              auVar27._8_8_ = 0;
              auVar27._0_8_ = dVar30;
              pdVar15 = pdVar19;
              if (3 < (int)uVar6) {
                lVar14 = 0;
                uVar13 = 0;
                do {
                  auVar31._8_8_ = 0;
                  auVar31._0_8_ = pdVar21[uVar13 - 3];
                  auVar11._8_8_ = 0;
                  auVar11._0_8_ = pdVar19[uVar13];
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = dVar30;
                  auVar11 = vfmadd213sd_fma(auVar31,auVar28,auVar11);
                  pdVar19[uVar13] = auVar11._0_8_;
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = pdVar21[uVar13 - 2];
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = pdVar19[uVar13 + 1];
                  auVar11 = vfmadd213sd_fma(auVar32,auVar28,auVar2);
                  pdVar19[uVar13 + 1] = auVar11._0_8_;
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = pdVar21[uVar13 - 1];
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = pdVar19[uVar13 + 2];
                  auVar11 = vfmadd213sd_fma(auVar33,auVar27,auVar3);
                  pdVar19[uVar13 + 2] = auVar11._0_8_;
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = pdVar21[uVar13];
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = pdVar19[uVar13 + 3];
                  auVar11 = vfmadd213sd_fma(auVar34,auVar27,auVar4);
                  pdVar19[uVar13 + 3] = auVar11._0_8_;
                  uVar13 = uVar13 + 4;
                  lVar14 = lVar14 + 0x20;
                } while ((long)uVar13 < (long)(int)(uVar18 & 0xfffffffc));
                pdVar15 = (double *)(lVar14 + (long)pdVar19);
              }
              if ((int)uVar13 < (int)uVar6) {
                lVar14 = 0;
                do {
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = pdVar26[(uVar13 & 0xffffffff) + lVar14];
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar15[lVar14];
                  auVar11 = vfmadd213sd_fma(auVar35,auVar27,auVar5);
                  pdVar15[lVar14] = auVar11._0_8_;
                  lVar14 = lVar14 + 1;
                } while (uVar24 - (uVar13 & 0xffffffff) != lVar14);
              }
              uVar20 = uVar20 + 1;
              pdVar25 = pdVar25 + uVar12;
              pdVar16 = pdVar16 + uVar12;
              pdVar21 = pdVar21 + uVar12;
              pdVar26 = pdVar26 + uVar12;
            } while (uVar20 != uVar24);
          }
          pdVar19 = pdVar19 + iVar8;
          pdVar22 = pdVar22 + iVar8;
          iVar17 = iVar17 + 1;
          pdVar23 = pdVar23 + iVar8;
        } while (iVar17 != endPattern);
      }
      local_a0 = local_a0 + 1;
      local_a4 = local_a4 + iVar9 * iVar8;
      local_70 = local_70 + iVar10;
      local_90 = local_90 + iVar10;
      local_78 = local_78 + iVar10;
      local_98 = local_98 + iVar10;
    } while (local_a0 != iVar7);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsPartials(REALTYPE* destP,
                                                                const REALTYPE* partials1,
                                                                const REALTYPE* matrices1,
                                                                const REALTYPE* partials2,
                                                                const REALTYPE* matrices2,
                                                                int startPattern,
                                                                int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum2A = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                // sum2A + sum2B = M_j P_j
                // Now 2nd loop
                tmpdestPtr = destPtr;
                REALTYPE  MjPj = (sum2A + sum2B) * partials1Ptr[i];

                for (j = 0; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }

}